

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

PointerType __thiscall capnp::_::PointerReader::getPointerType(PointerReader *this)

{
  bool bVar1;
  Kind KVar2;
  Fault local_60;
  Fault f_1;
  DebugExpression<bool> _kjCondition;
  Fault local_48;
  Fault f;
  Maybe<const_capnp::word_&> local_38;
  SegmentReader *local_30;
  SegmentReader *sgmt;
  word *refTarget;
  WirePointer *ptr;
  PointerReader *this_local;
  
  if ((this->pointer == (WirePointer *)0x0) ||
     (ptr = (WirePointer *)this, bVar1 = WirePointer::isNull(this->pointer), bVar1)) {
    this_local._4_4_ = NULL_;
  }
  else {
    refTarget = (word *)this->pointer;
    sgmt = (SegmentReader *)WirePointer::target((WirePointer *)refTarget,this->segment);
    local_30 = this->segment;
    WireHelpers::followFars
              ((WireHelpers *)&local_38,(WirePointer **)&refTarget,(word *)sgmt,&local_30);
    bVar1 = kj::Maybe<const_capnp::word_&>::operator==(&local_38);
    if (bVar1) {
      this_local._4_4_ = NULL_;
    }
    else {
      KVar2 = WirePointer::kind((WirePointer *)refTarget);
      switch(KVar2) {
      case STRUCT:
        this_local._4_4_ = STRUCT;
        break;
      case LIST:
        this_local._4_4_ = LIST;
        break;
      case FAR:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
                  (&local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0xad5,FAILED,(char *)0x0,"\"far pointer not followed?\"",
                   (char (*) [26])"far pointer not followed?");
        this_local._4_4_ = NULL_;
        kj::_::Debug::Fault::~Fault(&local_48);
        break;
      case OTHER:
        f_1.exception._2_1_ = WirePointer::isCapability((WirePointer *)refTarget);
        f_1.exception._3_1_ =
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (bool *)((long)&f_1.exception + 2));
        bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                          ((DebugExpression *)((long)&f_1.exception + 3));
        if (bVar1) {
          this_local._4_4_ = CAPABILITY;
        }
        else {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[21]>
                    (&local_60,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0xadb,FAILED,"ptr->isCapability()","_kjCondition,\"unknown pointer type\"",
                     (DebugExpression<bool> *)((long)&f_1.exception + 3),
                     (char (*) [21])"unknown pointer type");
          this_local._4_4_ = NULL_;
          kj::_::Debug::Fault::~Fault(&local_60);
        }
        break;
      default:
        kj::_::unreachable();
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

PointerType PointerReader::getPointerType() const {
  if(pointer == nullptr || pointer->isNull()) {
    return PointerType::NULL_;
  } else {
    const WirePointer* ptr = pointer;
    const word* refTarget = ptr->target(segment);
    SegmentReader* sgmt = segment;
    if (WireHelpers::followFars(ptr, refTarget, sgmt) == kj::none) return PointerType::NULL_;
    switch(ptr->kind()) {
      case WirePointer::FAR:
        KJ_FAIL_ASSERT("far pointer not followed?") { return PointerType::NULL_; }
      case WirePointer::STRUCT:
        return PointerType::STRUCT;
      case WirePointer::LIST:
        return PointerType::LIST;
      case WirePointer::OTHER:
        KJ_REQUIRE(ptr->isCapability(), "unknown pointer type") { return PointerType::NULL_; }
        return PointerType::CAPABILITY;
    }
    KJ_UNREACHABLE;
  }
}